

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

bool __thiscall
Hpipe::Instruction::find_rec(Instruction *this,function<bool_(Hpipe::Instruction_*)> *f)

{
  pointer pTVar1;
  Instruction *this_00;
  bool bVar2;
  bool bVar3;
  pointer pTVar4;
  function<bool_(Hpipe::Instruction_*)> local_50;
  
  if (this->op_id == cur_op_id) {
    bVar3 = false;
  }
  else {
    this->op_id = cur_op_id;
    bVar2 = std::function<bool_(Hpipe::Instruction_*)>::operator()(f,this);
    bVar3 = true;
    if (!bVar2) {
      pTVar4 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
               super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar1 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
               super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        bVar2 = pTVar4 == pTVar1;
        bVar3 = !bVar2;
        if (bVar2) {
          return bVar3;
        }
        this_00 = pTVar4->inst;
        std::function<bool_(Hpipe::Instruction_*)>::function(&local_50,f);
        bVar2 = find_rec(this_00,&local_50);
        std::_Function_base::~_Function_base(&local_50.super__Function_base);
        pTVar4 = pTVar4 + 1;
      } while (!bVar2);
    }
  }
  return bVar3;
}

Assistant:

bool Instruction::find_rec( std::function<bool (Instruction *)> f ) {
    if ( op_id == Instruction::cur_op_id )
        return false;
    op_id = Instruction::cur_op_id;

    if ( f( this ) )
        return true;

    for( Transition &t : next )
        if ( t.inst->find_rec( f ) )
            return true;
    return false;
}